

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall
program_options::unknown_option::unknown_option(unknown_option *this,string *original_token)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  error_with_no_option_name *unaff_retaddr;
  allocator<char> local_31;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  string *template_;
  
  template_ = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  error_with_no_option_name::error_with_no_option_name(unaff_retaddr,template_,in_RSI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  *(undefined ***)in_RDI = &PTR__unknown_option_00152a38;
  return;
}

Assistant:

unknown_option(const std::string& original_token = "")
    : error_with_no_option_name("unrecognised option '%canonical_option%'", original_token)
    {
    }